

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_map_s.hpp
# Opt level: O1

void __thiscall
estl::
sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
::sort(sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
       *this)

{
  ulong uVar1;
  pointer pvVar2;
  long lVar3;
  
  uVar1 = (this->data_vec_).size_;
  if (uVar1 != 0) {
    pvVar2 = (this->data_vec_).data_ptr_;
    lVar3 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<std::pair<std::__cxx11::string,std::__cxx11::string>*,long,__gnu_cxx::__ops::_Iter_comp_iter<estl::sort_map_s<std::__cxx11::string,std::__cxx11::string,30ul,std::less<std::__cxx11::string>,10ul>::comperator>>
              (pvVar2,pvVar2 + uVar1,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<std::pair<std::__cxx11::string,std::__cxx11::string>*,__gnu_cxx::__ops::_Iter_comp_iter<estl::sort_map_s<std::__cxx11::string,std::__cxx11::string,30ul,std::less<std::__cxx11::string>,10ul>::comperator>>
              (pvVar2,pvVar2 + uVar1);
  }
  this->is_sorted_ = true;
  return;
}

Assistant:

void sort()
    {
        std::sort(data_vec_.begin(), data_vec_.end(), comperator_);
        is_sorted_ = true;
    }